

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Extractor *rhs)

{
  ExtractorPrivate *pEVar1;
  Allocator *pAVar2;
  Allocator *pAVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  int iVar38;
  ExtractorPrivate *pEVar39;
  
  this->_vptr_Extractor = (_func_int **)&PTR__Extractor_0059b448;
  pEVar39 = (ExtractorPrivate *)operator_new(0x60);
  ExtractorPrivate::ExtractorPrivate(pEVar39,(Net *)0x0);
  this->d = pEVar39;
  pEVar1 = rhs->d;
  pEVar39->net = pEVar1->net;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
            (&pEVar39->blob_mats,&pEVar1->blob_mats);
  pEVar1 = rhs->d;
  pEVar39 = this->d;
  bVar34 = (pEVar1->opt).lightmode;
  bVar35 = (pEVar1->opt).use_shader_pack8;
  bVar36 = (pEVar1->opt).use_subgroup_ops;
  bVar37 = (pEVar1->opt).use_reserved_0;
  iVar38 = (pEVar1->opt).num_threads;
  pAVar2 = (pEVar1->opt).blob_allocator;
  pAVar3 = (pEVar1->opt).workspace_allocator;
  iVar29 = (pEVar1->opt).openmp_blocktime;
  bVar30 = (pEVar1->opt).use_winograd_convolution;
  bVar31 = (pEVar1->opt).use_sgemm_convolution;
  bVar32 = (pEVar1->opt).use_int8_inference;
  bVar33 = (pEVar1->opt).use_vulkan_compute;
  bVar16 = (pEVar1->opt).use_bf16_storage;
  bVar17 = (pEVar1->opt).use_fp16_packed;
  bVar18 = (pEVar1->opt).use_fp16_storage;
  bVar19 = (pEVar1->opt).use_fp16_arithmetic;
  bVar20 = (pEVar1->opt).use_int8_packed;
  bVar21 = (pEVar1->opt).use_int8_storage;
  bVar22 = (pEVar1->opt).use_int8_arithmetic;
  bVar23 = (pEVar1->opt).use_packing_layout;
  iVar24 = (pEVar1->opt).vulkan_device_index;
  bVar25 = (pEVar1->opt).use_reserved_1;
  bVar26 = (pEVar1->opt).use_image_storage;
  bVar27 = (pEVar1->opt).use_tensor_storage;
  bVar28 = (pEVar1->opt).use_reserved_2;
  bVar4 = (pEVar1->opt).use_local_pool_allocator;
  bVar5 = (pEVar1->opt).use_shader_local_memory;
  bVar6 = (pEVar1->opt).use_cooperative_matrix;
  bVar7 = (pEVar1->opt).use_winograd23_convolution;
  bVar8 = (pEVar1->opt).use_winograd43_convolution;
  bVar9 = (pEVar1->opt).use_winograd63_convolution;
  bVar10 = (pEVar1->opt).use_a53_a55_optimized_kernel;
  bVar11 = (pEVar1->opt).use_fp16_uniform;
  bVar12 = (pEVar1->opt).use_int8_uniform;
  bVar13 = (pEVar1->opt).use_reserved_9;
  bVar14 = (pEVar1->opt).use_reserved_10;
  bVar15 = (pEVar1->opt).use_reserved_11;
  (pEVar39->opt).flush_denormals = (pEVar1->opt).flush_denormals;
  (pEVar39->opt).use_local_pool_allocator = bVar4;
  (pEVar39->opt).use_shader_local_memory = bVar5;
  (pEVar39->opt).use_cooperative_matrix = bVar6;
  (pEVar39->opt).use_winograd23_convolution = bVar7;
  (pEVar39->opt).use_winograd43_convolution = bVar8;
  (pEVar39->opt).use_winograd63_convolution = bVar9;
  (pEVar39->opt).use_a53_a55_optimized_kernel = bVar10;
  (pEVar39->opt).use_fp16_uniform = bVar11;
  (pEVar39->opt).use_int8_uniform = bVar12;
  (pEVar39->opt).use_reserved_9 = bVar13;
  (pEVar39->opt).use_reserved_10 = bVar14;
  (pEVar39->opt).use_reserved_11 = bVar15;
  (pEVar39->opt).use_bf16_storage = bVar16;
  (pEVar39->opt).use_fp16_packed = bVar17;
  (pEVar39->opt).use_fp16_storage = bVar18;
  (pEVar39->opt).use_fp16_arithmetic = bVar19;
  (pEVar39->opt).use_int8_packed = bVar20;
  (pEVar39->opt).use_int8_storage = bVar21;
  (pEVar39->opt).use_int8_arithmetic = bVar22;
  (pEVar39->opt).use_packing_layout = bVar23;
  (pEVar39->opt).vulkan_device_index = iVar24;
  (pEVar39->opt).use_reserved_1 = bVar25;
  (pEVar39->opt).use_image_storage = bVar26;
  (pEVar39->opt).use_tensor_storage = bVar27;
  (pEVar39->opt).use_reserved_2 = bVar28;
  (pEVar39->opt).workspace_allocator = pAVar3;
  (pEVar39->opt).openmp_blocktime = iVar29;
  (pEVar39->opt).use_winograd_convolution = bVar30;
  (pEVar39->opt).use_sgemm_convolution = bVar31;
  (pEVar39->opt).use_int8_inference = bVar32;
  (pEVar39->opt).use_vulkan_compute = bVar33;
  (pEVar39->opt).lightmode = bVar34;
  (pEVar39->opt).use_shader_pack8 = bVar35;
  (pEVar39->opt).use_subgroup_ops = bVar36;
  (pEVar39->opt).use_reserved_0 = bVar37;
  (pEVar39->opt).num_threads = iVar38;
  (pEVar39->opt).blob_allocator = pAVar2;
  return;
}

Assistant:

Extractor::Extractor(const Extractor& rhs)
    : d(new ExtractorPrivate(0))
{
    d->net = rhs.d->net;
    d->blob_mats = rhs.d->blob_mats;
    d->opt = rhs.d->opt;

#if NCNN_VULKAN
    d->local_blob_vkallocator = 0;
    d->local_staging_vkallocator = 0;

    d->blob_mats_gpu = rhs.d->blob_mats_gpu;
    d->blob_mats_gpu_image = rhs.d->blob_mats_gpu_image;
#endif // NCNN_VULKAN
}